

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdarith.c
# Opt level: O2

void start_pass(j_decompress_ptr cinfo)

{
  double dVar1;
  int iVar2;
  jpeg_inverse_dct *pjVar3;
  JQUANT_TBL *pJVar4;
  void *pvVar5;
  jpeg_error_mgr *pjVar6;
  int iVar7;
  int row;
  long lVar8;
  J_DCT_METHOD JVar9;
  J_DCT_METHOD JVar10;
  code *pcVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  jpeg_component_info *pjVar15;
  
  pjVar15 = cinfo->comp_info;
  pjVar3 = cinfo->idct;
  lVar14 = 0;
  pcVar11 = (inverse_DCT_method_ptr)0x0;
  JVar9 = JDCT_ISLOW;
  do {
    if (cinfo->num_components <= lVar14) {
      return;
    }
    iVar2 = pjVar15->DCT_h_scaled_size;
    iVar7 = iVar2 * 0x100 + pjVar15->DCT_v_scaled_size;
    if (iVar7 == 0x101) {
      pcVar11 = jpeg_idct_1x1;
LAB_0023ddb7:
      JVar10 = JDCT_ISLOW;
    }
    else {
      if (iVar7 == 0x102) {
        pcVar11 = jpeg_idct_1x2;
        goto LAB_0023ddb7;
      }
      if (iVar7 == 0x201) {
        pcVar11 = jpeg_idct_2x1;
        goto LAB_0023ddb7;
      }
      if (iVar7 == 0x1010) {
        pcVar11 = jpeg_idct_16x16;
        goto LAB_0023ddb7;
      }
      if (iVar7 == 0x204) {
        pcVar11 = jpeg_idct_2x4;
        goto LAB_0023ddb7;
      }
      if (iVar7 == 0x303) {
        pcVar11 = jpeg_idct_3x3;
        goto LAB_0023ddb7;
      }
      if (iVar7 == 0x306) {
        pcVar11 = jpeg_idct_3x6;
        goto LAB_0023ddb7;
      }
      if (iVar7 == 0x402) {
        pcVar11 = jpeg_idct_4x2;
        goto LAB_0023ddb7;
      }
      if (iVar7 == 0x404) {
        pcVar11 = jpeg_idct_4x4;
        goto LAB_0023ddb7;
      }
      if (iVar7 == 0x408) {
        pcVar11 = jpeg_idct_4x8;
        goto LAB_0023ddb7;
      }
      if (iVar7 == 0x505) {
        pcVar11 = jpeg_idct_5x5;
        goto LAB_0023ddb7;
      }
      if (iVar7 == 0x50a) {
        pcVar11 = jpeg_idct_5x10;
        goto LAB_0023ddb7;
      }
      if (iVar7 == 0x603) {
        pcVar11 = jpeg_idct_6x3;
        goto LAB_0023ddb7;
      }
      if (iVar7 == 0x606) {
        pcVar11 = jpeg_idct_6x6;
        goto LAB_0023ddb7;
      }
      if (iVar7 == 0x60c) {
        pcVar11 = jpeg_idct_6x12;
        goto LAB_0023ddb7;
      }
      if (iVar7 == 0x707) {
        pcVar11 = jpeg_idct_7x7;
        goto LAB_0023ddb7;
      }
      if (iVar7 == 0x70e) {
        pcVar11 = jpeg_idct_7x14;
        goto LAB_0023ddb7;
      }
      if (iVar7 == 0x804) {
        pcVar11 = jpeg_idct_8x4;
        goto LAB_0023ddb7;
      }
      if (iVar7 != 0x808) {
        if (iVar7 == 0x810) {
          pcVar11 = jpeg_idct_8x16;
        }
        else if (iVar7 == 0x909) {
          pcVar11 = jpeg_idct_9x9;
        }
        else if (iVar7 == 0xa05) {
          pcVar11 = jpeg_idct_10x5;
        }
        else if (iVar7 == 0xa0a) {
          pcVar11 = jpeg_idct_10x10;
        }
        else if (iVar7 == 0xb0b) {
          pcVar11 = jpeg_idct_11x11;
        }
        else if (iVar7 == 0xc06) {
          pcVar11 = jpeg_idct_12x6;
        }
        else if (iVar7 == 0xc0c) {
          pcVar11 = jpeg_idct_12x12;
        }
        else if (iVar7 == 0xd0d) {
          pcVar11 = jpeg_idct_13x13;
        }
        else if (iVar7 == 0xe07) {
          pcVar11 = jpeg_idct_14x7;
        }
        else if (iVar7 == 0xe0e) {
          pcVar11 = jpeg_idct_14x14;
        }
        else if (iVar7 == 0xf0f) {
          pcVar11 = jpeg_idct_15x15;
        }
        else if (iVar7 == 0x1008) {
          pcVar11 = jpeg_idct_16x8;
        }
        else {
          if (iVar7 != 0x202) {
            pjVar6 = cinfo->err;
            pjVar6->msg_code = 7;
            (pjVar6->msg_parm).i[0] = iVar2;
            (cinfo->err->msg_parm).i[1] = pjVar15->DCT_v_scaled_size;
            pjVar6 = cinfo->err;
            goto LAB_0023de84;
          }
          pcVar11 = jpeg_idct_2x2;
        }
        goto LAB_0023ddb7;
      }
      JVar10 = cinfo->dct_method;
      if ((ulong)JVar10 < 3) {
        pcVar11 = (code *)(&PTR_jpeg_idct_islow_00378500)[JVar10];
      }
      else {
        pjVar6 = cinfo->err;
        pjVar6->msg_code = 0x31;
LAB_0023de84:
        (*pjVar6->error_exit)((j_common_ptr)cinfo);
        JVar10 = JVar9;
      }
    }
    pjVar3->inverse_DCT[lVar14] = pcVar11;
    if (((pjVar15->component_needed != 0) &&
        (*(J_DCT_METHOD *)((long)pjVar3[1].inverse_DCT + lVar14 * 4 + -8) != JVar10)) &&
       (pJVar4 = pjVar15->quant_table, pJVar4 != (JQUANT_TBL *)0x0)) {
      *(J_DCT_METHOD *)((long)pjVar3[1].inverse_DCT + lVar14 * 4 + -8) = JVar10;
      pvVar5 = pjVar15->dct_table;
      lVar8 = 0;
      if (JVar10 == JDCT_ISLOW) {
        for (; lVar8 != 0x40; lVar8 = lVar8 + 1) {
          *(uint *)((long)pvVar5 + lVar8 * 4) = (uint)pJVar4->quantval[lVar8];
        }
      }
      else if (JVar10 == JDCT_IFAST) {
        for (; lVar8 != 0x80; lVar8 = lVar8 + 2) {
          *(int *)((long)pvVar5 + lVar8 * 2) =
               (int)((long)*(short *)((long)start_pass::aanscales + lVar8) *
                     (ulong)*(ushort *)((long)pJVar4->quantval + lVar8) + 0x800 >> 0xc);
        }
      }
      else {
        lVar12 = 0;
        for (; lVar8 != 8; lVar8 = lVar8 + 1) {
          dVar1 = start_pass::aanscalefactor[lVar8];
          lVar12 = (long)(int)lVar12;
          for (lVar13 = 0; lVar13 != 0x40; lVar13 = lVar13 + 8) {
            *(float *)((long)pvVar5 + lVar12 * 4) =
                 (float)((double)pJVar4->quantval[lVar12] * dVar1 *
                         *(double *)((long)start_pass::aanscalefactor + lVar13) * 0.125);
            lVar12 = lVar12 + 1;
          }
        }
      }
    }
    lVar14 = lVar14 + 1;
    pjVar15 = pjVar15 + 1;
    JVar9 = JVar10;
  } while( true );
}

Assistant:

METHODDEF(void)
start_pass (j_decompress_ptr cinfo)
{
  arith_entropy_ptr entropy = (arith_entropy_ptr) cinfo->entropy;
  int ci, tbl;
  jpeg_component_info * compptr;

  if (cinfo->progressive_mode) {
    /* Validate progressive scan parameters */
    if (cinfo->Ss == 0) {
      if (cinfo->Se != 0)
	goto bad;
    } else {
      /* need not check Ss/Se < 0 since they came from unsigned bytes */
      if (cinfo->Se < cinfo->Ss || cinfo->Se > cinfo->lim_Se)
	goto bad;
      /* AC scans may have only one component */
      if (cinfo->comps_in_scan != 1)
	goto bad;
    }
    if (cinfo->Ah != 0) {
      /* Successive approximation refinement scan: must have Al = Ah-1. */
      if (cinfo->Ah-1 != cinfo->Al)
	goto bad;
    }
    if (cinfo->Al > 13) {	/* need not check for < 0 */
      bad:
      ERREXIT4(cinfo, JERR_BAD_PROGRESSION,
	       cinfo->Ss, cinfo->Se, cinfo->Ah, cinfo->Al);
    }
    /* Update progression status, and verify that scan order is legal.
     * Note that inter-scan inconsistencies are treated as warnings
     * not fatal errors ... not clear if this is right way to behave.
     */
    for (ci = 0; ci < cinfo->comps_in_scan; ci++) {
      int coefi, cindex = cinfo->cur_comp_info[ci]->component_index;
      int *coef_bit_ptr = & cinfo->coef_bits[cindex][0];
      if (cinfo->Ss && coef_bit_ptr[0] < 0) /* AC without prior DC scan */
	WARNMS2(cinfo, JWRN_BOGUS_PROGRESSION, cindex, 0);
      for (coefi = cinfo->Ss; coefi <= cinfo->Se; coefi++) {
	int expected = (coef_bit_ptr[coefi] < 0) ? 0 : coef_bit_ptr[coefi];
	if (cinfo->Ah != expected)
	  WARNMS2(cinfo, JWRN_BOGUS_PROGRESSION, cindex, coefi);
	coef_bit_ptr[coefi] = cinfo->Al;
      }
    }
    /* Select MCU decoding routine */
    if (cinfo->Ah == 0) {
      if (cinfo->Ss == 0)
	entropy->pub.decode_mcu = decode_mcu_DC_first;
      else
	entropy->pub.decode_mcu = decode_mcu_AC_first;
    } else {
      if (cinfo->Ss == 0)
	entropy->pub.decode_mcu = decode_mcu_DC_refine;
      else
	entropy->pub.decode_mcu = decode_mcu_AC_refine;
    }
  } else {
    /* Check that the scan parameters Ss, Se, Ah/Al are OK for sequential JPEG.
     * This ought to be an error condition, but we make it a warning.
     */
    if (cinfo->Ss != 0 || cinfo->Ah != 0 || cinfo->Al != 0 ||
	(cinfo->Se < DCTSIZE2 && cinfo->Se != cinfo->lim_Se))
      WARNMS(cinfo, JWRN_NOT_SEQUENTIAL);
    /* Select MCU decoding routine */
    entropy->pub.decode_mcu = decode_mcu;
  }

  /* Allocate & initialize requested statistics areas */
  for (ci = 0; ci < cinfo->comps_in_scan; ci++) {
    compptr = cinfo->cur_comp_info[ci];
    if (! cinfo->progressive_mode || (cinfo->Ss == 0 && cinfo->Ah == 0)) {
      tbl = compptr->dc_tbl_no;
      if (tbl < 0 || tbl >= NUM_ARITH_TBLS)
	ERREXIT1(cinfo, JERR_NO_ARITH_TABLE, tbl);
      if (entropy->dc_stats[tbl] == NULL)
	entropy->dc_stats[tbl] = (unsigned char *) (*cinfo->mem->alloc_small)
	  ((j_common_ptr) cinfo, JPOOL_IMAGE, DC_STAT_BINS);
      MEMZERO(entropy->dc_stats[tbl], DC_STAT_BINS);
      /* Initialize DC predictions to 0 */
      entropy->last_dc_val[ci] = 0;
      entropy->dc_context[ci] = 0;
    }
    if ((! cinfo->progressive_mode && cinfo->lim_Se) ||
	(cinfo->progressive_mode && cinfo->Ss)) {
      tbl = compptr->ac_tbl_no;
      if (tbl < 0 || tbl >= NUM_ARITH_TBLS)
	ERREXIT1(cinfo, JERR_NO_ARITH_TABLE, tbl);
      if (entropy->ac_stats[tbl] == NULL)
	entropy->ac_stats[tbl] = (unsigned char *) (*cinfo->mem->alloc_small)
	  ((j_common_ptr) cinfo, JPOOL_IMAGE, AC_STAT_BINS);
      MEMZERO(entropy->ac_stats[tbl], AC_STAT_BINS);
    }
  }

  /* Initialize arithmetic decoding variables */
  entropy->c = 0;
  entropy->a = 0;
  entropy->ct = -16;	/* force reading 2 initial bytes to fill C */

  /* Initialize restart counter */
  entropy->restarts_to_go = cinfo->restart_interval;
}